

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_renderer_base.h
# Opt level: O3

void __thiscall
agg::
renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
::blend_solid_hspan(renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
                    *this,int x,int y,int len,color_type *c,cover_type *covers)

{
  int iVar1;
  
  if ((y <= (this->m_clip_box).y2) && ((this->m_clip_box).y1 <= y)) {
    iVar1 = (this->m_clip_box).x1;
    if (iVar1 - x != 0 && x <= iVar1) {
      len = (x - iVar1) + len;
      if (len < 1) {
        return;
      }
      covers = covers + (iVar1 - x);
      x = iVar1;
    }
    iVar1 = (this->m_clip_box).x2;
    if (iVar1 < x + len) {
      iVar1 = iVar1 - x;
      if (iVar1 < 0) {
        return;
      }
      len = iVar1 + 1;
    }
    pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>
    ::blend_solid_hspan(this->m_ren,x,y,len,c,covers);
    return;
  }
  return;
}

Assistant:

void blend_solid_hspan(int x, int y, int len, 
                               const color_type& c, 
                               const cover_type* covers)
        {
            if(y > ymax()) return;
            if(y < ymin()) return;

            if(x < xmin())
            {
                len -= xmin() - x;
                if(len <= 0) return;
                covers += xmin() - x;
                x = xmin();
            }
            if(x + len > xmax())
            {
                len = xmax() - x + 1;
                if(len <= 0) return;
            }
            m_ren->blend_solid_hspan(x, y, len, c, covers);
        }